

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaybeRemovedValue.hpp
# Opt level: O0

MaybeRemovedValue<supermap::ByteArray<1UL>_>
supermap::io::DeserializeHelper<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_void>::
deserialize(istream *is)

{
  bool bVar1;
  undefined8 extraout_RDX;
  ByteArray<1UL> in_RDI;
  MaybeRemovedValue<supermap::ByteArray<1UL>_> MVar2;
  istream *in_stack_ffffffffffffffb8;
  
  deserialize<supermap::ByteArray<1ul>,void>(in_stack_ffffffffffffffb8);
  bVar1 = deserialize<bool,void>((istream *)0x12b905);
  MVar2._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  MVar2.removed = bVar1;
  *(bool *)((long)in_RDI.data_._M_t.
                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 8) = bVar1;
  MVar2.value.data_._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
  ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       in_RDI.data_._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
       ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  return MVar2;
}

Assistant:

static MaybeRemovedValue<T> deserialize(std::istream &is) {
        return {
            io::deserialize<T>(is),
            io::deserialize<bool>(is)
        };
    }